

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

void duckdb_je_extent_dalloc_gap(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *edata)

{
  _Bool _Var1;
  
  _Var1 = duckdb_je_emap_register_boundary(tsdn,pac->emap,edata,0xe8,false);
  if (_Var1) {
    duckdb_je_edata_cache_put(tsdn,pac->edata_cache,edata);
    return;
  }
  duckdb_je_extent_dalloc_wrapper(tsdn,pac,ehooks,edata);
  return;
}

Assistant:

void
extent_dalloc_gap(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    edata_t *edata) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	if (extent_register(tsdn, pac, edata)) {
		edata_cache_put(tsdn, pac->edata_cache, edata);
		return;
	}
	extent_dalloc_wrapper(tsdn, pac, ehooks, edata);
}